

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall pegmatite::ExprPtr::ExprPtr(ExprPtr *this,char *s)

{
  StringExpr *this_00;
  char *s_local;
  ExprPtr *this_local;
  
  this_00 = (StringExpr *)operator_new(0x20);
  anon_unknown.dwarf_50a29::StringExpr::StringExpr(this_00,s);
  std::shared_ptr<pegmatite::Expr>::shared_ptr<(anonymous_namespace)::StringExpr,void>
            (&this->super_shared_ptr<pegmatite::Expr>,this_00);
  return;
}

Assistant:

ExprPtr::ExprPtr(const char *s) : std::shared_ptr<Expr>(new StringExpr(s)) {}